

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_0::ImageClearingTestInstance::beginCommandBuffer
          (ImageClearingTestInstance *this,VkCommandBufferUsageFlags usageFlags)

{
  DeviceInterface *pDVar1;
  VkResult result;
  VkCommandBuffer_s **ppVVar2;
  undefined4 local_38 [2];
  VkCommandBufferBeginInfo commandBufferBeginInfo;
  VkCommandBufferUsageFlags usageFlags_local;
  ImageClearingTestInstance *this_local;
  
  commandBufferBeginInfo.pInheritanceInfo._4_4_ = usageFlags;
  memset(local_38,0,0x20);
  local_38[0] = 0x2a;
  commandBufferBeginInfo.pNext._0_4_ = commandBufferBeginInfo.pInheritanceInfo._4_4_;
  pDVar1 = this->m_vkd;
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  result = (*pDVar1->_vptr_DeviceInterface[0x49])(pDVar1,*ppVVar2,local_38);
  ::vk::checkResult(result,"m_vkd.beginCommandBuffer(*m_commandBuffer, &commandBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiImageClearingTests.cpp"
                    ,0x2b1);
  return;
}

Assistant:

void ImageClearingTestInstance::beginCommandBuffer (VkCommandBufferUsageFlags usageFlags) const
{
	const VkCommandBufferBeginInfo			commandBufferBeginInfo	=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,			// VkStructureType                          sType;
		DE_NULL,												// const void*                              pNext;
		usageFlags,												// VkCommandBufferUsageFlags                flags;
		DE_NULL													// const VkCommandBufferInheritanceInfo*    pInheritanceInfo;
	};

	VK_CHECK(m_vkd.beginCommandBuffer(*m_commandBuffer, &commandBufferBeginInfo));
}